

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O1

int mg_session_write_integer(mg_session *session,int64_t value)

{
  int iVar1;
  ulong in_RAX;
  size_t len;
  ushort uVar2;
  uint uVar3;
  ulong local_18;
  
  local_18 = in_RAX;
  if (0x8f < value + 0x10U) {
    local_18._1_7_ = (undefined7)(in_RAX >> 8);
    if ((char)value != value) {
      uVar2 = (ushort)value;
      if ((short)uVar2 == value) {
        local_18 = CONCAT71(local_18._1_7_,0xc9);
        iVar1 = mg_session_write_raw(session,(char *)&local_18,1);
        if (iVar1 != 0) {
          return iVar1;
        }
        local_18 = CONCAT62(local_18._2_6_,uVar2 << 8 | uVar2 >> 8);
        len = 2;
      }
      else {
        uVar3 = (uint)value;
        if ((int)uVar3 == value) {
          local_18 = CONCAT71(local_18._1_7_,0xca);
          iVar1 = mg_session_write_raw(session,(char *)&local_18,1);
          if (iVar1 != 0) {
            return iVar1;
          }
          local_18 = CONCAT44(local_18._4_4_,
                              uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                              uVar3 << 0x18);
          len = 4;
        }
        else {
          local_18 = CONCAT71(local_18._1_7_,0xcb);
          iVar1 = mg_session_write_raw(session,(char *)&local_18,1);
          if (iVar1 != 0) {
            return iVar1;
          }
          local_18 = (ulong)value >> 0x38 | (value & 0xff000000000000U) >> 0x28 |
                     (value & 0xff0000000000U) >> 0x18 | (value & 0xff00000000U) >> 8 |
                     (value & 0xff000000U) << 8 | (value & 0xff0000U) << 0x18 |
                     (value & 0xff00U) << 0x28 | value << 0x38;
          len = 8;
        }
      }
      goto LAB_00108203;
    }
    local_18 = CONCAT71(local_18._1_7_,200);
    iVar1 = mg_session_write_raw(session,(char *)&local_18,1);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  local_18 = CONCAT71(local_18._1_7_,(char)value);
  len = 1;
LAB_00108203:
  iVar1 = mg_session_write_raw(session,(char *)&local_18,len);
  return iVar1;
}

Assistant:

int mg_session_write_integer(mg_session *session, int64_t value) {
  if (value >= MG_TINY_INT_MIN && value <= MG_TINY_INT_MAX) {
    return mg_session_write_uint8(session, (uint8_t)value);
  }
  if (value >= INT8_MIN && value <= INT8_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_8));
    return mg_session_write_uint8(session, (uint8_t)value);
  }
  if (value >= INT16_MIN && value <= INT16_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_16));
    return mg_session_write_uint16(session, (uint16_t)value);
  }
  if (value >= INT32_MIN && value <= INT32_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_32));
    return mg_session_write_uint32(session, (uint32_t)value);
  }
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_INT_64));
  return mg_session_write_uint64(session, (uint64_t)value);
}